

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::EmbeddingLayerParams::_InternalParse
          (EmbeddingLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  WeightParams *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
      if (bVar1) {
        return local_40;
      }
      local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
      tag_00 = local_34;
      uVar3 = local_34 >> 3;
      cVar4 = (char)local_34;
      if (uVar3 != 0x15) break;
      if (cVar4 != -0x56) goto LAB_001fbcb2;
      msg = _internal_mutable_bias(this);
LAB_001fbca0:
      local_40 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,local_40);
LAB_001fbcda:
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if (uVar3 != 2) {
      if (uVar3 == 10) {
        if (cVar4 == 'P') {
          uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
          this->hasbias_ = uVar2 != 0;
          goto LAB_001fbc84;
        }
      }
      else if (uVar3 == 0x14) {
        if (cVar4 == -0x5e) {
          msg = _internal_mutable_weights(this);
          goto LAB_001fbca0;
        }
      }
      else if ((uVar3 == 1) && (cVar4 == '\b')) {
        uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
        this->inputdim_ = uVar2;
        goto LAB_001fbc84;
      }
LAB_001fbcb2:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
      goto LAB_001fbcda;
    }
    if (cVar4 != '\x10') goto LAB_001fbcb2;
    uVar2 = google::protobuf::internal::ReadVarint64(&local_40);
    this->outputchannels_ = uVar2;
LAB_001fbc84:
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* EmbeddingLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 inputDim = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          inputdim_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 outputChannels = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          outputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool hasBias = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          hasbias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams weights = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr = ctx->ParseMessage(_internal_mutable_weights(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams bias = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}